

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O2

bool bssl::dtls1_get_message(SSL *ssl,SSLMessage *out)

{
  undefined1 *puVar1;
  _Tuple_impl<0UL,_bssl::DTLSIncomingMessage_*,_bssl::internal::Deleter> this;
  size_t sVar2;
  bool bVar3;
  size_t in_R9;
  Span<const_unsigned_char> in;
  CBS CVar4;
  
  bVar3 = dtls1_is_current_message_complete(ssl);
  if (bVar3) {
    this.super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>._M_head_impl =
         ssl->d1->incoming_messages[ssl->d1->handshake_read_seq % 7]._M_t.
         super___uniq_ptr_impl<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bssl::DTLSIncomingMessage_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>;
    out->type = *(uint8_t *)
                 this.super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>._M_head_impl;
    sVar2 = *(size_t *)
             ((long)this.super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>._M_head_impl +
             0x10);
    (out->raw).data =
         ((Array<unsigned_char> *)
         ((long)this.super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>._M_head_impl + 8))->
         data_;
    (out->raw).len = sVar2;
    CVar4 = (CBS)DTLSIncomingMessage::msg
                           ((DTLSIncomingMessage *)
                            this.super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>.
                            _M_head_impl);
    out->body = CVar4;
    out->is_v2_hello = false;
    if ((ssl->s3->field_0xdc & 8) == 0) {
      in.size_ = in_R9;
      in.data_ = (uchar *)(out->raw).len;
      ssl_do_msg_callback((bssl *)ssl,(SSL *)0x0,0x16,(int)(out->raw).data,in);
      puVar1 = &ssl->s3->field_0xdc;
      *(ushort *)puVar1 = *(ushort *)puVar1 | 8;
    }
  }
  return bVar3;
}

Assistant:

bool dtls1_get_message(const SSL *ssl, SSLMessage *out) {
  if (!dtls1_is_current_message_complete(ssl)) {
    return false;
  }

  size_t idx = ssl->d1->handshake_read_seq % SSL_MAX_HANDSHAKE_FLIGHT;
  const DTLSIncomingMessage *frag = ssl->d1->incoming_messages[idx].get();
  out->type = frag->type;
  out->raw = CBS(frag->data);
  out->body = CBS(frag->msg());
  out->is_v2_hello = false;
  if (!ssl->s3->has_message) {
    ssl_do_msg_callback(ssl, 0 /* read */, SSL3_RT_HANDSHAKE, out->raw);
    ssl->s3->has_message = true;
  }
  return true;
}